

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex.h
# Opt level: O1

string * __thiscall
directed_flag_complex_cell_t::to_string_abi_cxx11_
          (string *__return_storage_ptr__,directed_flag_complex_cell_t *this,unsigned_short dim)

{
  uint uVar1;
  uint __len;
  uint __val;
  ushort uVar2;
  string __str;
  long *local_58 [2];
  long local_48 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar2 = 0;
  do {
    uVar1 = (**this->_vptr_directed_flag_complex_cell_t)(this,(ulong)uVar2);
    __val = uVar1 & 0xffff;
    __len = 1;
    if (((9 < (ushort)uVar1) && (__len = 2, 99 < (ushort)uVar1)) && (__len = 3, 999 < __val)) {
      __len = 5 - (__val < 10000);
    }
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct((ulong)local_58,(char)__len);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_58[0],__len,__val);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_58[0]);
    if (local_58[0] != local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
    if (uVar2 < dim) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    uVar2 = uVar2 + 1;
  } while (uVar2 <= dim);
  return __return_storage_ptr__;
}

Assistant:

const std::string to_string(
#ifdef USE_CELLS_WITHOUT_DIMENSION
	    unsigned short dim
#endif
	) const {
		const directed_flag_complex_cell_t* t = this;
#ifndef USE_CELLS_WITHOUT_DIMENSION
		unsigned short dim = dimension();
#endif
		std::string s;
		for (unsigned short index = 0; index < dim + 1; index++) {
			s += std::to_string(t->vertex(index));
			if (index < dim) s += "|";
		}
		return s;
	}